

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O3

_Bool ggml_backend_cpu_buffer_cpy_tensor
                (ggml_backend_buffer_t buffer,ggml_tensor *src,ggml_tensor *dst)

{
  ggml_backend_buffer_type_t pgVar1;
  _func__Bool_ggml_backend_buffer_type_t *p_Var2;
  void *__dest;
  void *__src;
  _Bool _Var3;
  size_t __n;
  
  pgVar1 = src->buffer->buft;
  p_Var2 = (pgVar1->iface).is_host;
  if ((p_Var2 != (_func__Bool_ggml_backend_buffer_type_t *)0x0) &&
     (_Var3 = (*p_Var2)(pgVar1), _Var3)) {
    __dest = dst->data;
    __src = src->data;
    __n = ggml_nbytes(src);
    memcpy(__dest,__src,__n);
    return true;
  }
  return false;
}

Assistant:

static bool ggml_backend_cpu_buffer_cpy_tensor(ggml_backend_buffer_t buffer, const struct ggml_tensor * src, struct ggml_tensor * dst) {
    if (ggml_backend_buffer_is_host(src->buffer)) {
        memcpy(dst->data, src->data, ggml_nbytes(src));
        return true;
    }
    return false;

    GGML_UNUSED(buffer);
}